

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_fmgen.cpp
# Opt level: O0

void __thiscall FM::Operator::EGUpdate(Operator *this)

{
  int iVar1;
  uint local_24;
  int level;
  Operator *this_local;
  
  local_24 = this->eg_level_;
  if ((this->inverted_ & 1U) != 0) {
    local_24 = 0x200 - local_24 & 0x3ff;
  }
  iVar1 = Min(this->tl_out_ + local_24,0x3ff);
  this->eg_out_ = iVar1 << 3;
  return;
}

Assistant:

inline void Operator::EGUpdate()
{
#if 1	// libOPNMIDI: experimental SSG-EG
	int level = eg_level_;
	level = (!inverted_) ? level : (512 - level) & 0x3ff;
	eg_out_ = Min(tl_out_ + level, 0x3ff) << (1 + 2);
#else
	if (!ssg_type_)
	{
		eg_out_ = Min(tl_out_ + eg_level_, 0x3ff) << (1 + 2);
	}
	else
	{
		eg_out_ = Min(tl_out_ + eg_level_ * ssg_vector_ + ssg_offset_, 0x3ff) << (1 + 2);
	}
#endif
}